

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::TestResult::Failed(TestResult *this)

{
  int iVar1;
  int i;
  TestPartResult *pTVar2;
  int iVar3;
  
  iVar1 = 0;
  do {
    i = iVar1;
    iVar3 = (int)(((long)(this->test_part_results_).
                         super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->test_part_results_).
                        super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x70);
    if (iVar3 <= i) break;
    pTVar2 = GetTestPartResult(this,i);
    iVar1 = i + 1;
  } while (1 < pTVar2->type_ - kNonFatalFailure);
  return i < iVar3;
}

Assistant:

bool TestResult::Failed() const {
  for (int i = 0; i < total_part_count(); ++i) {
    if (GetTestPartResult(i).failed())
      return true;
  }
  return false;
}